

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O2

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
mocker::LoopInvariantCodeMotion::findLoopInvariantComputation
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LoopInvariantCodeMotion *this,size_t header,UseDefChain *useDef)

{
  unsigned_long uVar1;
  _List_node_base *v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer puVar3;
  bool bVar4;
  mapped_type *s;
  BasicBlock *pBVar5;
  mapped_type *pmVar6;
  pointer puVar7;
  element_type *peVar8;
  unsigned_long __tmp;
  unsigned_long __args;
  _List_node_base *p_Var9;
  size_t elseLabel;
  shared_ptr<mocker::ir::Call> call;
  value_type inst;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mustPass;
  element_type *local_188;
  shared_ptr<mocker::ir::IRInst> def;
  shared_ptr<mocker::ir::Branch> br;
  size_t header_local;
  function<void_(unsigned_long)> visit;
  shared_ptr<mocker::ir::Reg> reg;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  related;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  res;
  queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
  worklist;
  RegSet loopInvVars;
  
  header_local = header;
  s = std::__detail::
      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)&this->loopTree,&header_local);
  res._M_h._M_buckets = &res._M_h._M_single_bucket;
  res._M_h._M_bucket_count = 1;
  res._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  res._M_h._M_element_count = 0;
  res._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  res._M_h._M_rehash_policy._M_next_resize = 0;
  res._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LoopInfo::getLoopInvariantVariables(&loopInvVars,&this->loopTree,header_local);
  std::
  queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
  ::
  queue<std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>,void>
            (&worklist);
  pBVar5 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,header_local);
  ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
            ((ir *)&br,
             (shared_ptr<mocker::ir::IRInst> *)
             ((pBVar5->insts).
              super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev + 1));
  uVar1 = (((br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->then).
           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id;
  elseLabel = (((br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               else_).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id;
  bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                    (s,&elseLabel);
  __args = uVar1;
  if (bVar4) {
    __args = elseLabel;
    elseLabel = uVar1;
  }
  bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                    (s,&elseLabel);
  if (bVar4) {
    *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  else {
    mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    visit.super__Function_base._M_manager = (_Manager_type)0x0;
    visit._M_invoker = (_Invoker_type)0x0;
    visit.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    visit.super__Function_base._M_functor._8_8_ = 0;
    visit.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(function<void_(unsigned_long)> **)visit.super__Function_base._M_functor._M_unused._0_8_ =
         &visit;
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
     ((long)visit.super__Function_base._M_functor._M_unused._0_8_ + 8) = &mustPass;
    *(LoopInvariantCodeMotion **)
     ((long)visit.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = this;
    visit._M_invoker =
         std::
         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
         ::_M_invoke;
    visit.super__Function_base._M_manager =
         std::
         _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
         ::_M_manager;
    std::function<void_(unsigned_long)>::operator()(&visit,__args);
    puVar3 = mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar7 = mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
      pBVar5 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,*puVar7);
      p_Var9 = (_List_node_base *)&pBVar5->insts;
      while (p_Var9 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var9 != (_List_node_base *)&pBVar5->insts) {
        v = p_Var9 + 1;
        ir::getDest((shared_ptr<mocker::ir::IRInst> *)&related);
        if (related._M_h._M_buckets != (__buckets_ptr)0x0) {
          bVar4 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                            (&loopInvVars,(shared_ptr<mocker::ir::Reg> *)&related);
          if (bVar4) {
            call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)v->_M_next;
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&res._M_h,(ir *)&call);
            ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&call,(shared_ptr<mocker::ir::IRInst> *)v);
            if (call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::
              deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::emplace_back<std::shared_ptr<mocker::ir::IRInst>const&>
                        ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                          *)&worklist,(shared_ptr<mocker::ir::IRInst> *)v);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&related._M_h._M_bucket_count);
      }
    }
    related._M_h._M_buckets = &related._M_h._M_single_bucket;
    related._M_h._M_bucket_count = 1;
    related._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    related._M_h._M_element_count = 0;
    related._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    related._M_h._M_rehash_policy._M_next_resize = 0;
    related._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while( true ) {
      if (worklist.c.
          super__Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          worklist.c.
          super__Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>,
                 &(worklist.c.
                   super__Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>);
      std::
      deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
      ::pop_front(&worklist.c);
      call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_emplace<unsigned_long>
                (&related._M_h,
                 (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  *)&call);
      ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           *)&call,(shared_ptr<mocker::ir::IRInst> *)
                                   &inst.
                                    super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                         );
      _Var2 = call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      for (peVar8 = call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar8 != (element_type *)_Var2._M_pi; peVar8 = (element_type *)&peVar8->super_Definition)
      {
        ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&reg);
        if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          pmVar6 = std::__detail::
                   _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::at((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)useDef,(key_type *)&reg);
          std::__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>,
                     &(pmVar6->inst).
                      super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>);
          local_188 = def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)&related._M_h,(unsigned_long *)&local_188);
          if (!bVar4) {
            std::
            deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
            ::emplace_back<std::shared_ptr<mocker::ir::IRInst>&>
                      ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                        *)&worklist,
                       (shared_ptr<mocker::ir::IRInst> *)
                       &def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&def.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      std::
      vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 *)&call);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&inst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    intersectSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
              (&res,&related);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&__return_storage_ptr__->_M_h,&res._M_h);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&related._M_h);
    std::_Function_base::~_Function_base(&visit.super__Function_base);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&mustPass.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&br.super___shared_ptr<mocker::ir::Branch,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  ::~deque(&worklist.c);
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&loopInvVars._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&res._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<ir::InstID>
LoopInvariantCodeMotion::findLoopInvariantComputation(
    std::size_t header, const UseDefChain &useDef) {
  const auto &loopNodes = loopTree.getLoops().at(header);

  std::unordered_set<ir::InstID> res;

  auto loopInvVars = loopTree.getLoopInvariantVariables(header);
  std::queue<std::shared_ptr<ir::IRInst>> worklist;

  // we only hoist Calls that can not be avoided
  auto &headerBB = func.getBasicBlock(header);
  auto br = ir::dyc<ir::Branch>(headerBB.getInsts().back());
  auto thenLabel = br->getThen()->getID(), elseLabel = br->getElse()->getID();

  if (isIn(loopNodes, elseLabel))
    std::swap(thenLabel, elseLabel);

  if (isIn(loopNodes, elseLabel))
    return {};

  std::vector<std::size_t> mustPass;
  std::function<void(std::size_t)> visit = [&visit, &mustPass,
                                            this](std::size_t cur) {
    mustPass.emplace_back(cur);
    auto succs = func.getBasicBlock(cur).getSuccessors();
    if (succs.size() != 1)
      return;
    visit(succs.at(0));
  };
  visit(thenLabel);

  for (auto &node : mustPass) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest || !isIn(loopInvVars, dest))
        continue;
      res.emplace(inst->getID());
      if (auto call = ir::dyc<ir::Call>(inst)) {
        worklist.emplace(inst);
      }
    }
  }

  std::unordered_set<ir::InstID> related;
  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    related.emplace(inst->getID());
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      if (auto reg = ir::dycLocalReg(operand)) {
        auto def = useDef.getDef(reg).getInst();
        if (!isIn(related, def->getID()))
          worklist.emplace(def);
      }
    }
  }

  intersectSet(res, related);
  return res;
}